

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatMap.h
# Opt level: O1

void __thiscall
FlatMap<double,MyStruct,std::less<double>>::insert<std::pair<double,MyStruct>const*>
          (FlatMap<double,MyStruct,std::less<double>> *this,pair<double,_MyStruct> *first,
          pair<double,_MyStruct> *last)

{
  long lVar1;
  pair<double,_MyStruct> *ppVar2;
  long lVar3;
  __normal_iterator<std::pair<double,_MyStruct>_*,_std::vector<std::pair<double,_MyStruct>,_std::allocator<std::pair<double,_MyStruct>_>_>_>
  _Var4;
  _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<double,_MyStruct>_*,_std::vector<std::pair<double,_MyStruct>,_std::allocator<std::pair<double,_MyStruct>_>_>_>,_std::pair<double,_MyStruct>_>
  _Stack_38;
  
  if (first != last) {
    lVar3 = *(long *)(this + 8);
    lVar1 = *(long *)this;
    std::vector<std::pair<double,MyStruct>,std::allocator<std::pair<double,MyStruct>>>::
    _M_range_insert<std::pair<double,MyStruct>const*>
              ((vector<std::pair<double,MyStruct>,std::allocator<std::pair<double,MyStruct>>> *)this
               ,lVar3,first,last);
    _Var4._M_current = (pair<double,_MyStruct> *)((lVar3 - lVar1) + *(long *)this);
    ppVar2 = *(pair<double,_MyStruct> **)(this + 8);
    if (_Var4._M_current != ppVar2) {
      lVar3 = ((long)ppVar2 - (long)_Var4._M_current >> 4) * 0x6db6db6db6db6db7;
      std::
      _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<double,_MyStruct>_*,_std::vector<std::pair<double,_MyStruct>,_std::allocator<std::pair<double,_MyStruct>_>_>_>,_std::pair<double,_MyStruct>_>
      ::_Temporary_buffer(&_Stack_38,_Var4,(lVar3 - (lVar3 + 1 >> 0x3f)) + 1 >> 1);
      if (_Stack_38._M_buffer == (pointer)0x0) {
        std::
        __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::pair<double,MyStruct>*,std::vector<std::pair<double,MyStruct>,std::allocator<std::pair<double,MyStruct>>>>,__gnu_cxx::__ops::_Iter_comp_iter<FlatMap<double,MyStruct,std::less<double>>::ValueToValueComparator>>
                  (_Var4._M_current,ppVar2);
      }
      else {
        std::
        __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::pair<double,MyStruct>*,std::vector<std::pair<double,MyStruct>,std::allocator<std::pair<double,MyStruct>>>>,std::pair<double,MyStruct>*,long,__gnu_cxx::__ops::_Iter_comp_iter<FlatMap<double,MyStruct,std::less<double>>::ValueToValueComparator>>
                  (_Var4._M_current,ppVar2,_Stack_38._M_buffer,_Stack_38._M_len);
      }
      operator_delete(_Stack_38._M_buffer);
    }
    std::
    __inplace_merge<__gnu_cxx::__normal_iterator<std::pair<double,MyStruct>*,std::vector<std::pair<double,MyStruct>,std::allocator<std::pair<double,MyStruct>>>>,__gnu_cxx::__ops::_Iter_comp_iter<FlatMap<double,MyStruct,std::less<double>>::ValueToValueComparator>>
              (*(undefined8 *)this,_Var4._M_current,*(undefined8 *)(this + 8));
    _Var4 = std::
            __unique<__gnu_cxx::__normal_iterator<std::pair<double,MyStruct>*,std::vector<std::pair<double,MyStruct>,std::allocator<std::pair<double,MyStruct>>>>,__gnu_cxx::__ops::_Iter_comp_iter<FlatMap<double,MyStruct,std::less<double>>::insert<std::pair<double,MyStruct>const*>(std::pair<double,MyStruct>const*,std::pair<double,MyStruct>const*)::_lambda(std::pair<double,MyStruct>const&,std::pair<double,MyStruct>const&)_1_>>
                      (*(pair<double,_MyStruct> **)this,*(pair<double,_MyStruct> **)(this + 8),
                       (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_tdepke2[P]CircuitSim2_src___FlatMap_h:175:62)>
                        )this);
    std::vector<std::pair<double,_MyStruct>,_std::allocator<std::pair<double,_MyStruct>_>_>::
    _M_erase((vector<std::pair<double,_MyStruct>,_std::allocator<std::pair<double,_MyStruct>_>_> *)
             this,(iterator)_Var4._M_current,*(pair<double,_MyStruct> **)(this + 8));
  }
  return;
}

Assistant:

void insert(InputIt first, InputIt last) {
        if (first == last) {
            return;
        }

        auto insertStart = vec_.insert(vec_.end(), first, last);
        std::stable_sort(insertStart, vec_.end(), valueToValueComp_);
        std::inplace_merge(vec_.begin(), insertStart, vec_.end(), valueToValueComp_);
        auto newLast = std::unique(vec_.begin(), vec_.end(), [this](const value_type& lhs, const value_type& rhs) {
            return !comp_(lhs.first, rhs.first);
        });
        vec_.erase(newLast, vec_.end());

        //mergeUnique(first, last);
    }